

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFrames.c
# Opt level: O2

Aig_Man_t *
Aig_ManFrames(Aig_Man_t *pAig,int nFs,int fInit,int fOuts,int fRegs,int fEnlarge,
             Aig_Obj_t ***ppObjMap)

{
  Aig_Obj_t **pObjMap;
  Aig_Man_t *p;
  char *pcVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Aig_Obj_t *p1;
  int iVar6;
  int iVar7;
  size_t __size;
  long lVar8;
  int i;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  
  lVar9 = (long)nFs;
  lVar8 = pAig->vObjs->nSize * lVar9;
  __size = lVar8 * 8;
  pObjMap = (Aig_Obj_t **)malloc(__size);
  lVar12 = 0;
  memset(pObjMap,0,__size);
  p = Aig_ManStart((int)lVar8);
  pcVar1 = Abc_UtilStrsav(pAig->pName);
  p->pName = pcVar1;
  pcVar1 = Abc_UtilStrsav(pAig->pSpec);
  p->pSpec = pcVar1;
  iVar7 = 0;
  if (0 < nFs) {
    iVar7 = nFs;
  }
  for (; iVar7 != (int)lVar12; lVar12 = lVar12 + 1) {
    pObjMap[pAig->pConst1->Id * lVar9 + lVar12] = p->pConst1;
  }
  for (iVar10 = 0; iVar10 != iVar7; iVar10 = iVar10 + 1) {
    for (iVar6 = 0; iVar6 < pAig->nObjs[2] - pAig->nRegs; iVar6 = iVar6 + 1) {
      pvVar2 = Vec_PtrEntry(pAig->vCis,iVar6);
      pAVar3 = Aig_ObjCreateCi(p);
      pObjMap[*(int *)((long)pvVar2 + 0x24) * nFs + iVar10] = pAVar3;
    }
  }
  iVar10 = pAig->nObjs[2] - pAig->nRegs;
  if (fInit == 0) {
    for (; iVar10 < pAig->vCis->nSize; iVar10 = iVar10 + 1) {
      pvVar2 = Vec_PtrEntry(pAig->vCis,iVar10);
      pAVar3 = Aig_ObjCreateCi(p);
      pObjMap[*(int *)((long)pvVar2 + 0x24) * lVar9] = pAVar3;
    }
  }
  else {
    for (; iVar10 < pAig->vCis->nSize; iVar10 = iVar10 + 1) {
      pvVar2 = Vec_PtrEntry(pAig->vCis,iVar10);
      pObjMap[*(int *)((long)pvVar2 + 0x24) * lVar9] = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
    }
  }
  iVar6 = nFs + -1;
  iVar10 = 0;
  while (i = iVar10, i != iVar7) {
    for (iVar10 = 0; iVar10 < pAig->vObjs->nSize; iVar10 = iVar10 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar10);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
        pAVar4 = Aig_ObjChild0Frames(pObjMap,nFs,pAVar3,i);
        uVar5 = (ulong)pAVar3->pFanin1 & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)pAVar3->pFanin1 & 1) ^
               (ulong)pObjMap[*(int *)(uVar5 + 0x24) * nFs + i]);
        }
        pAVar4 = Aig_And(p,pAVar4,p1);
        pObjMap[pAVar3->Id * nFs + i] = pAVar4;
      }
    }
    for (iVar11 = 0; iVar10 = i + 1, iVar11 < pAig->nRegs; iVar11 = iVar11 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,(pAig->nObjs[3] - pAig->nRegs) + iVar11);
      pvVar2 = Vec_PtrEntry(pAig->vCis,(pAig->nObjs[2] - pAig->nRegs) + iVar11);
      if (i < iVar6) {
        pAVar3 = Aig_ObjChild0Frames(pObjMap,nFs,pAVar3,i);
        pObjMap[*(int *)((long)pvVar2 + 0x24) * nFs + i + 1] = pAVar3;
      }
    }
  }
  if (fOuts != 0) {
    iVar7 = iVar6;
    if (fEnlarge == 0) {
      iVar7 = 0;
    }
    for (; iVar7 < nFs; iVar7 = iVar7 + 1) {
      for (iVar10 = 0; iVar10 < pAig->nObjs[3] - pAig->nRegs; iVar10 = iVar10 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar10);
        pAVar4 = Aig_ObjChild0Frames(pObjMap,nFs,pAVar3,iVar7);
        pAVar4 = Aig_ObjCreateCo(p,pAVar4);
        pObjMap[pAVar3->Id * nFs + iVar7] = pAVar4;
      }
    }
  }
  if (fRegs != 0) {
    iVar7 = pAig->nRegs;
    p->nRegs = iVar7;
    iVar7 = pAig->nObjs[3] - iVar7;
    iVar10 = 0;
    if (fEnlarge == 0) {
      iVar10 = iVar6;
    }
    for (; iVar7 < pAig->vCos->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar7);
      pAVar4 = Aig_ObjChild0Frames(pObjMap,nFs,pAVar3,iVar10);
      pAVar4 = Aig_ObjCreateCo(p,pAVar4);
      pObjMap[pAVar3->Id * nFs + iVar6] = pAVar4;
    }
    Aig_ManSetRegNum(p,pAig->nRegs);
  }
  Aig_ManCleanup(p);
  if (ppObjMap == (Aig_Obj_t ***)0x0) {
    free(pObjMap);
  }
  else {
    *ppObjMap = pObjMap;
  }
  return p;
}

Assistant:

Aig_Man_t * Aig_ManFrames( Aig_Man_t * pAig, int nFs, int fInit, int fOuts, int fRegs, int fEnlarge, Aig_Obj_t *** ppObjMap )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f;

    // create mapping for the frames nodes
    pObjMap  = ABC_ALLOC( Aig_Obj_t *, nFs * Aig_ManObjNumMax(pAig) );
    memset( pObjMap, 0, sizeof(Aig_Obj_t *) * nFs * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFs );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFs; f++ )
        Aig_ObjSetFrames( pObjMap, nFs, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFs; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFs, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    if ( fInit )
    {
        Aig_ManForEachLoSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFs, pObj, 0, Aig_ManConst0(pFrames) );
    }
    else 
    {
        Aig_ManForEachLoSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFs, pObj, 0, Aig_ObjCreateCi(pFrames) );
    }

    // add timeframes
    for ( f = 0; f < nFs; f++ )
    {
//        printf( "Frame = %d.\n", f );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
        {
//            Aig_Obj_t * pFanin0 = Aig_ObjChild0Frames(pObjMap,nFs,pObj,f);
//            Aig_Obj_t * pFanin1 = Aig_ObjChild1Frames(pObjMap,nFs,pObj,f);
//            printf( "Node = %3d.  Fanin0 = %3d. Fanin1 = %3d.\n", pObj->Id, Aig_Regular(pFanin0)->Id, Aig_Regular(pFanin1)->Id );
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFs,pObj,f), Aig_ObjChild1Frames(pObjMap,nFs,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFs, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFs,pObjLi,f);
            if ( f < nFs - 1 )
                Aig_ObjSetFrames( pObjMap, nFs, pObjLo, f+1, pObjNew );
        }
    }
    if ( fOuts )
    {
        for ( f = fEnlarge?nFs-1:0; f < nFs; f++ )
            Aig_ManForEachPoSeq( pAig, pObj, i )
            {
                pObjNew = Aig_ObjCreateCo( pFrames, Aig_ObjChild0Frames(pObjMap,nFs,pObj,f) );
                Aig_ObjSetFrames( pObjMap, nFs, pObj, f, pObjNew );
            }
    }
    if ( fRegs )
    {
        pFrames->nRegs = pAig->nRegs;
        Aig_ManForEachLiSeq( pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCo( pFrames, Aig_ObjChild0Frames(pObjMap,nFs,pObj,fEnlarge?0:nFs-1) );
            Aig_ObjSetFrames( pObjMap, nFs, pObj, nFs-1, pObjNew );
        }
        Aig_ManSetRegNum( pFrames, Aig_ManRegNum(pAig) );
    }
    Aig_ManCleanup( pFrames );
    // return the new manager
    if ( ppObjMap )
        *ppObjMap = pObjMap;
    else
        ABC_FREE( pObjMap );
    return pFrames;
}